

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O1

Int __thiscall
ipx::Maxvolume::ScaleFtran
          (Maxvolume *this,double colscale_jn,Vector *invscale_basic,IndexedVector *ftran)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  double *pdVar5;
  double *pdVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Int IVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  bVar8 = IndexedVector::sparse(ftran);
  if (bVar8) {
    iVar2 = ftran->nnz_;
    if (0 < (long)iVar2) {
      piVar4 = (ftran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (ftran->elements_)._M_data;
      pdVar6 = invscale_basic->_M_data;
      iVar9 = 0;
      dVar14 = 0.0;
      lVar13 = 0;
      do {
        iVar3 = piVar4[lVar13];
        dVar1 = pdVar5[iVar3];
        dVar15 = dVar1 * colscale_jn * pdVar6[iVar3];
        dVar16 = ABS(dVar15);
        if (dVar14 < dVar16 && 1e-07 < ABS(dVar1)) {
          iVar9 = iVar3;
          dVar14 = dVar16;
        }
        pdVar5[iVar3] = dVar15;
        lVar13 = lVar13 + 1;
      } while (iVar2 != lVar13);
      return iVar9;
    }
  }
  else {
    uVar11 = (uint)(ftran->elements_)._M_size;
    if (0 < (int)uVar11) {
      pdVar5 = (ftran->elements_)._M_data;
      pdVar6 = invscale_basic->_M_data;
      IVar10 = 0;
      dVar14 = 0.0;
      uVar12 = 0;
      do {
        dVar1 = pdVar5[uVar12];
        dVar16 = dVar1 * colscale_jn * pdVar6[uVar12];
        dVar15 = ABS(dVar16);
        bVar8 = ABS(dVar1) <= 1e-07;
        bVar7 = dVar15 <= dVar14;
        if (bVar7 || bVar8) {
          dVar15 = dVar14;
        }
        dVar14 = dVar15;
        if (!bVar7 && !bVar8) {
          IVar10 = (Int)uVar12;
        }
        pdVar5[uVar12] = dVar16;
        uVar12 = uVar12 + 1;
      } while ((uVar11 & 0x7fffffff) != uVar12);
      return IVar10;
    }
  }
  return 0;
}

Assistant:

Int Maxvolume::ScaleFtran(double colscale_jn, const Vector& invscale_basic,
                          IndexedVector& ftran) {
    double vmax = 0.0;
    Int pmax = 0;
    auto fcn = [&](Int p, double& pivot) {
        double scaled_pivot = pivot * colscale_jn * invscale_basic[p];
        double v = std::abs(scaled_pivot);
        if (v > vmax && std::abs(pivot) > kPivotZeroTol) {
            vmax = v;
            pmax = p;
        }
        pivot = scaled_pivot;
    };
    for_each_nonzero(ftran, fcn);
    return pmax;
}